

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::addOrSubtract
          (IEEEFloat *this,IEEEFloat *rhs,roundingMode rounding_mode,bool subtract)

{
  lostFraction lost_fraction_00;
  opStatus local_24;
  lostFraction lost_fraction;
  opStatus fs;
  bool subtract_local;
  roundingMode rounding_mode_local;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  local_24 = addOrSubtractSpecials(this,rhs,subtract);
  if (local_24 == opDivByZero) {
    lost_fraction_00 = addOrSubtractSignificand(this,rhs,subtract);
    local_24 = normalize(this,rounding_mode,lost_fraction_00);
    if ((this->field_0x12 & 7) == 3 && lost_fraction_00 != lfExactlyZero) {
      __assert_fail("category != fcZero || lost_fraction == lfExactlyZero",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x66e,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::addOrSubtract(const IEEEFloat &, roundingMode, bool)"
                   );
    }
  }
  if (((this->field_0x12 & 7) == 3) &&
     (((rhs->field_0x12 & 7) != 3 ||
      ((((byte)this->field_0x12 >> 3 & 1) == ((byte)rhs->field_0x12 >> 3 & 1)) == subtract)))) {
    this->field_0x12 = this->field_0x12 & 0xf7 | (rounding_mode == rmTowardNegative) << 3;
  }
  return local_24;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::addOrSubtract(const IEEEFloat &rhs,
                                             roundingMode rounding_mode,
                                             bool subtract) {
  opStatus fs;

  fs = addOrSubtractSpecials(rhs, subtract);

  /* This return code means it was not a simple case.  */
  if (fs == opDivByZero) {
    lostFraction lost_fraction;

    lost_fraction = addOrSubtractSignificand(rhs, subtract);
    fs = normalize(rounding_mode, lost_fraction);

    /* Can only be zero if we lost no fraction.  */
    assert(category != fcZero || lost_fraction == lfExactlyZero);
  }

  /* If two numbers add (exactly) to zero, IEEE 754 decrees it is a
     positive zero unless rounding to minus infinity, except that
     adding two like-signed zeroes gives that zero.  */
  if (category == fcZero) {
    if (rhs.category != fcZero || (sign == rhs.sign) == subtract)
      sign = (rounding_mode == rmTowardNegative);
  }

  return fs;
}